

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
CheckContext(JsrtContext *currentContext,bool verifyRuntimeState,
            bool allowInObjectBeforeCollectCallback)

{
  ScriptContext *pSVar1;
  Recycler *this;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  undefined4 *puVar5;
  size_t sVar6;
  RecyclableData *pRVar7;
  
  JVar4 = JsErrorNoCurrentContext;
  if (currentContext != (JsrtContext *)0x0) {
    JVar4 = JsNoError;
  }
  if (currentContext != (JsrtContext *)0x0 && verifyRuntimeState) {
    pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
             ptr;
    if (pSVar1 == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x3f,"(scriptContext != nullptr)","scriptContext != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    this = pSVar1->recycler;
    this_00 = pSVar1->threadContext;
    if (this != (Recycler *)0x0) {
      bVar3 = Memory::Recycler::IsHeapEnumInProgress(this);
      if (bVar3) {
        return JsErrorHeapEnumInProgress;
      }
      if ((!allowInObjectBeforeCollectCallback) &&
         (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None)) {
        return JsErrorInObjectBeforeCollectCallback;
      }
    }
    sVar6 = ThreadContext::GetStackLimitForCurrentThread(this_00);
    JVar4 = JsErrorInDisabledState;
    if ((sVar6 != 0x7fffffffffffffff) &&
       (JVar4 = JsErrorInThreadServiceCallback, (this_00->threadService).isInCallback == false)) {
      pRVar7 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&pSVar1->threadContext->recyclableData);
      JVar4 = JsErrorInExceptionState;
      if ((pRVar7->exceptionObject).ptr == (JavascriptExceptionObject *)0x0) {
        JVar4 = JsNoError;
      }
    }
  }
  return JVar4;
}

Assistant:

JsErrorCode CheckContext(JsrtContext *currentContext, bool verifyRuntimeState,
    bool allowInObjectBeforeCollectCallback)
{
    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    // We don't need parameter check if it's checked in previous wrapper.
    if (verifyRuntimeState)
    {
        Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
        Assert(scriptContext != nullptr);
        Recycler *recycler = scriptContext->GetRecycler();
        ThreadContext *threadContext = scriptContext->GetThreadContext();

        if (recycler && recycler->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (!allowInObjectBeforeCollectCallback &&
            recycler && recycler->IsInObjectBeforeCollectCallback())
        {
            return JsErrorInObjectBeforeCollectCallback;
        }
        else if (threadContext->IsExecutionDisabled())
        {
            return JsErrorInDisabledState;
        }
        else if (scriptContext->IsInProfileCallback())
        {
            return JsErrorInProfileCallback;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        // Make sure we don't have an outstanding exception.
        if (scriptContext->GetThreadContext()->GetRecordedException() != nullptr)
        {
            return JsErrorInExceptionState;
        }
    }

    return JsNoError;
}